

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

char * read_file(char *filename)

{
  FILE *__stream;
  size_t __n;
  char *__ptr;
  size_t sVar1;
  
  __stream = fopen(filename,"r");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    __n = ftell(__stream);
    rewind(__stream);
    __ptr = (char *)malloc(__n + 1);
    sVar1 = fread(__ptr,1,__n,__stream);
    if (__n == sVar1) {
      __ptr[__n] = '\0';
      return __ptr;
    }
    free(__ptr);
  }
  return (char *)0x0;
}

Assistant:

char *read_file(const char *filename) {
  char *buffer;
  FILE *file = fopen(filename, "r");

  if (file) {
    fseek(file, 0, SEEK_END);

    size_t string_size = (size_t) ftell(file);

    rewind(file);

    buffer = malloc(sizeof(char) * (string_size + 1));

    size_t read_size = fread(buffer, sizeof(char), string_size, file);

    if (string_size != read_size) {
      free(buffer);
      return NULL;
    }

    buffer[string_size] = 0;

    return buffer;
  }

  return NULL;
}